

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void hex_dump_c(char *addr,size_t len)

{
  long local_28;
  size_t n;
  char *addr_end;
  size_t len_local;
  char *addr_local;
  
  local_28 = 0;
  len_local = (size_t)addr;
  while (len_local < addr + len) {
    if (local_28 == 0) {
      printf("\"");
      local_28 = 0xe;
    }
    printf("\\x%02x",(ulong)*(byte *)len_local);
    len_local = len_local + 1;
    local_28 = local_28 + -1;
    if (local_28 == 0) {
      printf("\"\n");
    }
  }
  if (local_28 != 0) {
    printf("\"\n");
  }
  return;
}

Assistant:

void
hex_dump_c (const char *addr, size_t len) {
	const char *addr_end = addr + len;
	size_t n = 0;
	while (addr < addr_end) {
		if (n == 0) { printf("\""); n = 14; }
		printf("\\x%02x", *(unsigned char *)addr);
		addr += 1; n -= 1;
		if (n == 0) { printf("\"\n"); }
	}
	if (n != 0) { printf("\"\n"); }
}